

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::mrg3>(mrg3 *r,string *name)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uStack_38;
  
  uVar4 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar4 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar4 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar4);
  iVar6 = 0xf;
  do {
    iVar3 = (r->S).r[0];
    iVar1 = (r->S).r[1];
    uVar4 = (long)(r->S).r[2] * (long)(r->P).a[2] +
            (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar3;
    (r->S).r[2] = iVar1;
    (r->S).r[1] = iVar3;
    uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
    uVar4 = uVar5 - 0xfffffffe;
    if (uVar5 < 0xfffffffe) {
      uVar4 = uVar5;
    }
    iVar3 = (int)uVar4 + -0x7fffffff;
    if (uVar4 < 0x7fffffff) {
      iVar3 = (int)uVar4;
    }
    (r->S).r[0] = iVar3;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 6),1);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = (r->S).r[0];
  iVar3 = (r->S).r[1];
  uVar4 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar3 + (long)(r->P).a[0] * (long)iVar6;
  (r->S).r[2] = iVar3;
  (r->S).r[1] = iVar6;
  uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
  uVar4 = uVar5 - 0xfffffffe;
  if (uVar5 < 0xfffffffe) {
    uVar4 = uVar5;
  }
  iVar6 = (int)uVar4 + -0x7fffffff;
  if (uVar4 < 0x7fffffff) {
    iVar6 = (int)uVar4;
  }
  (r->S).r[0] = iVar6;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}